

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallProgramsCommand.cxx
# Opt level: O2

string * FindInstallSource_abi_cxx11_
                   (string *__return_storage_ptr__,cmMakefile *makefile,char *name)

{
  bool bVar1;
  size_type sVar2;
  string *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  string ts;
  char *local_c8;
  string local_c0;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  local_c8 = name;
  bVar1 = cmsys::SystemTools::FileIsFullPath(name);
  if (bVar1) {
LAB_002b0eb1:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,name,(allocator<char> *)&local_80);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,name,(allocator<char> *)&local_50);
  sVar2 = cmGeneratorExpression::Find((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar2 == 0) goto LAB_002b0eb1;
  psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(makefile);
  local_80.View_._M_str = (psVar3->_M_dataplus)._M_p;
  local_80.View_._M_len = psVar3->_M_string_length;
  local_50.View_._M_len = 1;
  local_50.Digits_[0] = '/';
  local_50.View_._M_str = local_50.Digits_;
  cmStrCat<char_const*>(&local_c0,&local_80,&local_50,&local_c8);
  psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(makefile);
  local_80.View_._M_str = (psVar3->_M_dataplus)._M_p;
  local_80.View_._M_len = psVar3->_M_string_length;
  local_50.View_._M_len = 1;
  local_50.Digits_[0] = '/';
  local_50.View_._M_str = local_50.Digits_;
  cmStrCat<char_const*>(&local_a0,&local_80,&local_50,&local_c8);
  bVar1 = cmsys::SystemTools::FileExists(&local_c0);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(&local_a0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar1) {
      paVar4 = &local_a0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p == paVar4) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_a0.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_a0.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_a0._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_a0.field_2._M_allocated_capacity;
      }
      psVar3 = &local_a0;
      goto LAB_002b0f2b;
    }
  }
  paVar4 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == paVar4) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_c0.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_c0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_c0._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_c0.field_2._M_allocated_capacity
    ;
  }
  psVar3 = &local_c0;
LAB_002b0f2b:
  psVar5 = &psVar3->_M_string_length;
  __return_storage_ptr__->_M_string_length = *psVar5;
  (((string *)(psVar5 + -1))->_M_dataplus)._M_p = (pointer)paVar4;
  *psVar5 = 0;
  paVar4->_M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

static std::string FindInstallSource(cmMakefile& makefile, const char* name)
{
  if (cmSystemTools::FileIsFullPath(name) ||
      cmGeneratorExpression::Find(name) == 0) {
    // This is a full path.
    return name;
  }

  // This is a relative path.
  std::string tb = cmStrCat(makefile.GetCurrentBinaryDirectory(), '/', name);
  std::string ts = cmStrCat(makefile.GetCurrentSourceDirectory(), '/', name);

  if (cmSystemTools::FileExists(tb)) {
    // The file exists in the binary tree.  Use it.
    return tb;
  }
  if (cmSystemTools::FileExists(ts)) {
    // The file exists in the source tree.  Use it.
    return ts;
  }
  // The file doesn't exist.  Assume it will be present in the
  // binary tree when the install occurs.
  return tb;
}